

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bimap.cpp
# Opt level: O2

void __thiscall BiMap_SetGet_Test::BiMap_SetGet_Test(BiMap_SetGet_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00189288;
  return;
}

Assistant:

TEST (BiMap, SetGet) {
    pstore::broker::bimap<std::string, int> bm;
    bm.set ("a", 42);
    bm.set ("b", 37);
    EXPECT_EQ (2U, bm.size ());
    EXPECT_EQ (42, bm.getr ("a"));
    EXPECT_EQ (37, bm.getr ("b"));
    EXPECT_EQ ("a", bm.getl (42));
    EXPECT_EQ ("b", bm.getl (37));
}